

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references.cc
# Opt level: O1

void brotli::CreateBackwardReferences<brotli::HashLongestMatchQuickly<16,2,false>>
               (size_t num_bytes,size_t position,bool is_last,uint8_t *ringbuffer,
               size_t ringbuffer_mask,int quality,int lgwin,
               HashLongestMatchQuickly<16,_2,_false> *hasher,int *dist_cache,size_t *last_insert_len
               ,Command *commands,size_t *num_commands,size_t *num_literals)

{
  bool bVar1;
  size_t sVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  long *plVar10;
  ulong uVar11;
  size_t distance_code;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  size_t best_len;
  ulong local_e8;
  long local_e0;
  Command *local_d8;
  size_t local_d0;
  long local_c8;
  ulong local_c0;
  double best_score;
  size_t best_dist;
  size_t best_len_code;
  ulong local_a0;
  double best_score_2;
  size_t best_dist_2;
  size_t best_len_code_2;
  ulong local_80;
  ulong local_78;
  uint8_t *local_70;
  long local_68;
  ulong local_60;
  long local_58;
  long local_50;
  Command cmd;
  
  local_d0 = ringbuffer_mask;
  if ((num_bytes < 0x801 && is_last) && position == 0) {
    if (num_bytes != 0) {
      sVar5 = 0;
      do {
        lVar8 = *(long *)(ringbuffer + sVar5);
        (hasher->buckets_ + ((ulong)(lVar8 * 0x1e35a7bd000000) >> 0x30))[0] = 0;
        (hasher->buckets_ + ((ulong)(lVar8 * 0x1e35a7bd000000) >> 0x30))[1] = 0;
        hasher->need_init_ = false;
        sVar5 = sVar5 + 1;
      } while (num_bytes != sVar5);
    }
  }
  else if (hasher->need_init_ == true) {
    memset(hasher,0,0x40009);
  }
  if (2 < position && 2 < num_bytes) {
    uVar4 = (uint)(position - 3);
    *(uint *)((long)hasher->buckets_ +
             (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position - 3 & local_d0)) *
                                            0x1e35a7bd000000) >> 0x30) +
                     (uint)((uVar4 >> 3 & 1) != 0)) * 4)) = uVar4;
    uVar4 = (uint)(position - 2);
    *(uint *)((long)hasher->buckets_ +
             (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position - 2 & local_d0)) *
                                            0x1e35a7bd000000) >> 0x30) +
                     (uint)((uVar4 >> 3 & 1) != 0)) * 4)) = uVar4;
    uVar4 = (uint)(position - 1);
    *(uint *)((long)hasher->buckets_ +
             (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + (position - 1 & local_d0)) *
                                            0x1e35a7bd000000) >> 0x30) +
                     (uint)((uVar4 >> 3 & 1) != 0)) * 4)) = uVar4;
  }
  sVar5 = *last_insert_len;
  uVar13 = local_d0 & position;
  local_e8 = uVar13 + num_bytes;
  local_50 = 0x200;
  if (quality < 9) {
    local_50 = 0x40;
  }
  local_d8 = commands;
  if (uVar13 + 7 < local_e8) {
    local_c0 = (ulong)((1 << ((byte)lgwin & 0x1f)) + -0x10);
    local_e0 = position - uVar13;
    uVar11 = local_50 + uVar13;
    local_60 = (ulong)(uint)((int)local_50 * 4);
    local_78 = local_e8 - 3;
    local_80 = local_e8 - 4;
    local_c8 = local_e0 + 1;
    local_58 = (uVar13 - 1) + num_bytes;
    local_68 = local_e0 + 2;
    local_70 = ringbuffer + 2;
    uVar14 = uVar13;
    do {
      uVar13 = uVar14 + local_e0;
      uVar7 = local_c0;
      if (uVar13 < local_c0) {
        uVar7 = uVar13;
      }
      best_len = 0;
      best_len_code = 0;
      best_dist = 0;
      best_score = 4.0;
      bVar3 = HashLongestMatchQuickly<16,_2,_false>::FindLongestMatch
                        (hasher,ringbuffer,local_d0,dist_cache,uVar13 & 0xffffffff,local_e8 - uVar14
                         ,uVar7,&best_len,&best_len_code,&best_dist,&best_score);
      if (bVar3) {
        uVar13 = local_58 - uVar14;
        local_a0 = 0;
        do {
          cmd._0_8_ = best_len - 1;
          if (uVar13 < best_len - 1) {
            cmd._0_8_ = uVar13;
          }
          uVar11 = 0;
          if (4 < quality) {
            cmd._0_8_ = uVar11;
          }
          best_len_code_2 = 0;
          best_dist_2 = 0;
          best_score_2 = 4.0;
          uVar6 = local_c8 + uVar14;
          uVar7 = local_c0;
          if (uVar6 < local_c0) {
            uVar7 = uVar6;
          }
          bVar3 = HashLongestMatchQuickly<16,_2,_false>::FindLongestMatch
                            (hasher,ringbuffer,local_d0,dist_cache,uVar6 & 0xffffffff,uVar13,uVar7,
                             (size_t *)&cmd,&best_len_code_2,&best_dist_2,&best_score_2);
          if (bVar3) {
            if (best_score + 7.0 <= best_score_2) {
              uVar14 = uVar14 + 1;
              sVar5 = sVar5 + 1;
              best_len._0_4_ = cmd.insert_len_;
              best_len._4_4_ = cmd.copy_len_;
              best_len_code = best_len_code_2;
              best_dist = best_dist_2;
              best_score = best_score_2;
              iVar12 = (int)local_a0;
              local_a0 = (ulong)(iVar12 + 1);
              uVar11 = (ulong)(iVar12 < 3);
            }
            else {
              uVar11 = 0;
            }
          }
          sVar2 = best_len;
          uVar13 = uVar13 - 1;
        } while ((char)uVar11 != '\0');
        uVar13 = uVar14 + local_e0;
        if (local_c0 <= uVar14 + local_e0) {
          uVar13 = local_c0;
        }
        if (uVar13 < best_dist) goto LAB_0016ab95;
        if (best_dist == (long)*dist_cache) {
          distance_code = 0;
        }
        else {
          distance_code = 1;
          if (((best_dist != (long)dist_cache[1]) &&
              (distance_code = 2, best_dist != (long)dist_cache[2])) &&
             (distance_code = 3, best_dist != (long)dist_cache[3])) {
            if (5 < best_dist && 3 < quality) {
              uVar11 = 4;
              bVar3 = false;
              do {
                if ((best_dist ==
                     (long)(int)(&kDistanceCacheOffset)[uVar11] +
                     (long)dist_cache[(uint)(&kDistanceCacheIndex)[uVar11]]) &&
                   (*(ulong *)(ComputeDistanceCode(unsigned_long,unsigned_long,int,int_const*)::
                               kLimits + uVar11 * 8) <= best_dist)) {
                  bVar1 = false;
                  distance_code = uVar11;
                }
                else {
                  bVar1 = true;
                }
                if (!bVar1) break;
                bVar3 = 0xe < uVar11;
                uVar11 = uVar11 + 1;
              } while (uVar11 != 0x10);
              if (!bVar3) goto LAB_0016ace7;
            }
LAB_0016ab95:
            distance_code = best_dist + 0xf;
          }
        }
LAB_0016ace7:
        if (distance_code != 0 && best_dist <= uVar13) {
          dist_cache[3] = dist_cache[2];
          *(undefined8 *)(dist_cache + 1) = *(undefined8 *)dist_cache;
          *dist_cache = (int)best_dist;
        }
        Command::Command(&cmd,sVar5,best_len,best_len_code,distance_code);
        local_d8->dist_extra_ = cmd.dist_extra_;
        local_d8->cmd_prefix_ = cmd.cmd_prefix_;
        local_d8->dist_prefix_ = cmd.dist_prefix_;
        local_d8->insert_len_ = cmd.insert_len_;
        local_d8->copy_len_ = cmd.copy_len_;
        local_d8->cmd_extra_ = cmd.cmd_extra_;
        *num_literals = *num_literals + sVar5;
        if (2 < best_len) {
          lVar8 = best_len - 2;
          lVar9 = local_68 + uVar14;
          plVar10 = (long *)(local_70 + uVar14);
          do {
            *(uint *)((long)hasher->buckets_ +
                     (ulong)(((uint)(ushort)((ulong)(*plVar10 * 0x1e35a7bd000000) >> 0x30) +
                             (uint)(((uint)lVar9 >> 3 & 1) != 0)) * 4)) = (uint)lVar9;
            lVar9 = lVar9 + 1;
            plVar10 = (long *)((long)plVar10 + 1);
            lVar8 = lVar8 + -1;
          } while (lVar8 != 0);
        }
        uVar11 = uVar14 + local_50 + sVar2 * 2;
        local_d8 = local_d8 + 1;
        uVar13 = best_len + uVar14;
        sVar5 = 0;
      }
      else {
        sVar5 = sVar5 + 1;
        uVar13 = uVar14 + 1;
        if (uVar11 < uVar13) {
          if (local_60 + uVar11 < uVar13) {
            uVar7 = uVar14 + 0x11;
            if (local_80 < uVar14 + 0x11) {
              uVar7 = local_80;
            }
            if (uVar13 < uVar7) {
              iVar12 = (int)uVar14 + (int)local_c8;
              do {
                *(int *)((long)hasher->buckets_ +
                        (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar13) *
                                                       0x1e35a7bd000000) >> 0x30) +
                                (uint)(((uint)((int)local_e0 + (int)uVar13) >> 3 & 1) != 0)) * 4)) =
                     iVar12;
                sVar5 = sVar5 + 4;
                uVar13 = uVar13 + 4;
                iVar12 = iVar12 + 4;
              } while (uVar13 < uVar7);
            }
          }
          else {
            uVar7 = uVar14 + 9;
            if (local_78 < uVar14 + 9) {
              uVar7 = local_78;
            }
            if (uVar13 < uVar7) {
              iVar12 = (int)uVar14 + (int)local_c8;
              do {
                *(int *)((long)hasher->buckets_ +
                        (ulong)(((uint)(ushort)((ulong)(*(long *)(ringbuffer + uVar13) *
                                                       0x1e35a7bd000000) >> 0x30) +
                                (uint)(((uint)((int)local_e0 + (int)uVar13) >> 3 & 1) != 0)) * 4)) =
                     iVar12;
                sVar5 = sVar5 + 2;
                uVar13 = uVar13 + 2;
                iVar12 = iVar12 + 2;
              } while (uVar13 < uVar7);
            }
          }
        }
      }
      uVar14 = uVar13;
    } while (uVar13 + 7 < local_e8);
  }
  *last_insert_len = (local_e8 - uVar13) + sVar5;
  *num_commands = *num_commands + ((long)local_d8 - (long)commands >> 3) * -0x5555555555555555;
  return;
}

Assistant:

void CreateBackwardReferences(size_t num_bytes,
                              size_t position,
                              bool is_last,
                              const uint8_t* ringbuffer,
                              size_t ringbuffer_mask,
                              const int quality,
                              const int lgwin,
                              Hasher* hasher,
                              int* dist_cache,
                              size_t* last_insert_len,
                              Command* commands,
                              size_t* num_commands,
                              size_t* num_literals) {
  // Set maximum distance, see section 9.1. of the spec.
  const size_t max_backward_limit = (1 << lgwin) - 16;

  // Choose which init method is faster.
  // memset is about 100 times faster than hasher->InitForData().
  const size_t kMaxBytesForPartialHashInit = Hasher::kHashMapSize >> 7;
  if (position == 0 && is_last && num_bytes <= kMaxBytesForPartialHashInit) {
    hasher->InitForData(ringbuffer, num_bytes);
  } else {
    hasher->Init();
  }
  if (num_bytes >= 3 && position >= 3) {
    // Prepare the hashes for three last bytes of the last write.
    // These could not be calculated before, since they require knowledge
    // of both the previous and the current block.
    hasher->Store(&ringbuffer[(position - 3) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 3));
    hasher->Store(&ringbuffer[(position - 2) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 2));
    hasher->Store(&ringbuffer[(position - 1) & ringbuffer_mask],
                  static_cast<uint32_t>(position - 1));
  }
  const Command * const orig_commands = commands;
  size_t insert_length = *last_insert_len;
  size_t i = position & ringbuffer_mask;
  const size_t i_diff = position - i;
  const size_t i_end = i + num_bytes;

  // For speed up heuristics for random data.
  const size_t random_heuristics_window_size = quality < 9 ? 64 : 512;
  size_t apply_random_heuristics = i + random_heuristics_window_size;

  // Minimum score to accept a backward reference.
  const int kMinScore = 4.0;

  while (i + Hasher::kHashTypeLength - 1 < i_end) {
    size_t max_length = i_end - i;
    size_t max_distance = std::min(i + i_diff, max_backward_limit);
    size_t best_len = 0;
    size_t best_len_code = 0;
    size_t best_dist = 0;
    double best_score = kMinScore;
    bool match_found = hasher->FindLongestMatch(
        ringbuffer, ringbuffer_mask,
        dist_cache, static_cast<uint32_t>(i + i_diff), max_length, max_distance,
        &best_len, &best_len_code, &best_dist, &best_score);
    if (match_found) {
      // Found a match. Let's look for something even better ahead.
      int delayed_backward_references_in_row = 0;
      for (;;) {
        --max_length;
        size_t best_len_2 =
            quality < 5 ? std::min(best_len - 1, max_length) : 0;
        size_t best_len_code_2 = 0;
        size_t best_dist_2 = 0;
        double best_score_2 = kMinScore;
        max_distance = std::min(i + i_diff + 1, max_backward_limit);
        match_found = hasher->FindLongestMatch(
            ringbuffer, ringbuffer_mask,
            dist_cache, static_cast<uint32_t>(i + i_diff + 1),
            max_length, max_distance,
            &best_len_2, &best_len_code_2, &best_dist_2, &best_score_2);
        double cost_diff_lazy = 7.0;
        if (match_found && best_score_2 >= best_score + cost_diff_lazy) {
          // Ok, let's just write one byte for now and start a match from the
            // next byte.
          ++i;
          ++insert_length;
          best_len = best_len_2;
          best_len_code = best_len_code_2;
          best_dist = best_dist_2;
          best_score = best_score_2;
          if (++delayed_backward_references_in_row < 4) {
            continue;
          }
        }
        break;
      }
      apply_random_heuristics =
          i + 2 * best_len + random_heuristics_window_size;
      max_distance = std::min(i + i_diff, max_backward_limit);
      // The first 16 codes are special shortcodes, and the minimum offset is 1.
      size_t distance_code =
          ComputeDistanceCode(best_dist, max_distance, quality, dist_cache);
      if (best_dist <= max_distance && distance_code > 0) {
        dist_cache[3] = dist_cache[2];
        dist_cache[2] = dist_cache[1];
        dist_cache[1] = dist_cache[0];
        dist_cache[0] = static_cast<int>(best_dist);
      }
      Command cmd(insert_length, best_len, best_len_code, distance_code);
      *commands++ = cmd;
      *num_literals += insert_length;
      insert_length = 0;
      // Put the hash keys into the table, if there are enough
      // bytes left.
      for (size_t j = 2; j < best_len; ++j) {
        hasher->Store(&ringbuffer[i + j],
                      static_cast<uint32_t>(i + i_diff + j));
      }
      i += best_len;
    } else {
      ++insert_length;
      ++i;
      // If we have not seen matches for a long time, we can skip some
      // match lookups. Unsuccessful match lookups are very very expensive
      // and this kind of a heuristic speeds up compression quite
      // a lot.
      if (i > apply_random_heuristics) {
        // Going through uncompressible data, jump.
        if (i > apply_random_heuristics + 4 * random_heuristics_window_size) {
          // It is quite a long time since we saw a copy, so we assume
          // that this data is not compressible, and store hashes less
          // often. Hashes of non compressible data are less likely to
          // turn out to be useful in the future, too, so we store less of
          // them to not to flood out the hash table of good compressible
          // data.
          size_t i_jump = std::min(i + 16, i_end - 4);
          for (; i < i_jump; i += 4) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 4;
          }
        } else {
          size_t i_jump = std::min(i + 8, i_end - 3);
          for (; i < i_jump; i += 2) {
            hasher->Store(ringbuffer + i, static_cast<uint32_t>(i + i_diff));
            insert_length += 2;
          }
        }
      }
    }
  }
  insert_length += i_end - i;
  *last_insert_len = insert_length;
  *num_commands += static_cast<size_t>(commands - orig_commands);
}